

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::addParticleQuantumNumber
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list)

{
  bool bVar1;
  int iVar2;
  vector<particle_info,_std::allocator<particle_info>_> *in_RDI;
  anon_struct_120_15_f999644b *part_i;
  iterator __end2;
  iterator __begin2;
  vector<particle_info,_std::allocator<particle_info>_> *__range2;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *__range1;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  local_40;
  vector<particle_info,_std::allocator<particle_info>_> *local_38;
  reference local_30;
  vector<particle_info,_std::allocator<particle_info>_> **local_28;
  __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (vector<particle_info,_std::allocator<particle_info>_> **)
       std::
       vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
       ::begin((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                *)in_RDI);
  local_28 = (vector<particle_info,_std::allocator<particle_info>_> **)
             std::
             vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             ::end((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
               ::operator*(local_20);
    local_38 = *local_30;
    local_40._M_current =
         (anon_struct_120_15_f999644b *)
         std::vector<particle_info,_std::allocator<particle_info>_>::begin(in_RDI);
    std::vector<particle_info,_std::allocator<particle_info>_>::end(in_RDI);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                          *)in_RDI);
      if (!bVar1) break;
      in_stack_ffffffffffffffb0 =
           __gnu_cxx::
           __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
           ::operator*(&local_40);
      iVar2 = particle_decay::get_particle_baryon_number
                        ((particle_decay *)in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffffb0->baryon = iVar2;
      __gnu_cxx::
      __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
      ::operator++(&local_40);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void particleSamples::addParticleQuantumNumber(
    vector<vector<particle_info> *> *input_particle_list) {
    for (auto &ev_i : (*input_particle_list)) {
        for (auto &part_i : (*ev_i)) {
            part_i.baryon =
                (decayer_ptr->get_particle_baryon_number(part_i.monval));
        }
    }
}